

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::reset(FederateState *this,CoreFederateInfo *fedInfo)

{
  TimeCoordinator *pTVar1;
  pointer pIVar2;
  pointer pGVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  undefined8 __p;
  TimeCoordinator *this_00;
  vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *__range1;
  pair<int,_TimeRepresentation<count_time<9,_long>_>_> *prop;
  pointer ppVar7;
  pointer ppVar8;
  pointer ppVar9;
  undefined1 local_68 [16];
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  LOCK();
  (this->state)._M_i = CREATED;
  UNLOCK();
  gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::clear
            (&this->queue);
  std::
  _Rb_tree<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>,_std::_Select1st<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  ::clear(&(this->delayQueues)._M_t);
  InterfaceInfo::reset(&this->interfaceInformation);
  this_00 = (TimeCoordinator *)operator_new(0x268);
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:168:43)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:168:43)>
             ::_M_manager;
  local_68._0_8_ = this;
  TimeCoordinator::TimeCoordinator
            (this_00,(function<void_(const_helics::ActionMessage_&)> *)local_68);
  CLI::std::_Function_base::~_Function_base((_Function_base *)local_68);
  pTVar1 = (this->timeCoord)._M_t.
           super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
           .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
  (this->timeCoord)._M_t.
  super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>._M_t
  .super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>.
  super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl = this_00;
  if (pTVar1 != (TimeCoordinator *)0x0) {
    (**(code **)((long)(pTVar1->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 8))();
  }
  this->only_transmit_on_change = false;
  this->realtime = false;
  this->observer = false;
  this->mSlowResponding = false;
  this->mSourceOnly = false;
  this->mCallbackBased = false;
  this->strict_input_type_checking = false;
  this->ignore_unit_mismatch = false;
  std::make_unique<helics::LogManager>();
  __p = local_68._0_8_;
  local_68._0_8_ = (void *)0x0;
  std::__uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>::reset
            ((__uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_> *)
             &this->mLogManager,(pointer)__p);
  std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::~unique_ptr
            ((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)local_68);
  this->maxLogLevel = -4;
  LOCK();
  (this->init_transmitted)._M_base._M_i = false;
  UNLOCK();
  (this->errorString)._M_string_length = 0;
  this->wait_for_current_time = false;
  this->ignore_time_mismatch_warnings = false;
  this->mProfilerActive = false;
  this->mLocalProfileCapture = false;
  this->errorCode = 0;
  *(this->errorString)._M_dataplus._M_p = '\0';
  (this->rt_lag).internalTimeCode = 0;
  (this->rt_lead).internalTimeCode = 0;
  (this->grantTimeOutPeriod).internalTimeCode = 0;
  this->realTimeTimerIndex = -1;
  this->grantTimeoutTimeIndex = -1;
  LOCK();
  (this->initRequested)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->requestingMode)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->initIterating)._M_base._M_i = false;
  UNLOCK();
  *(undefined1 *)((long)&this->mGrantCount + 3) = 0;
  *(undefined8 *)&this->iterating = 0;
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
  ::clear(&this->commandQueue);
  LOCK();
  (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i = 0;
  UNLOCK();
  pIVar2 = (this->events).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->events).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar2) {
    (this->events).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar2;
  }
  pIVar2 = (this->eventMessages).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->eventMessages).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar2) {
    (this->eventMessages).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar2;
  }
  pGVar3 = (this->delayedFederates).
           super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->delayedFederates).
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_finish != pGVar3) {
    (this->delayedFederates).
    super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar3;
  }
  (this->time_granted).internalTimeCode = -0x7fffffffffffffff;
  (this->allowed_send_time).internalTimeCode = -0x7fffffffffffffff;
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::clear(&this->queryCallbacks);
  local_68._0_8_ = (void *)0x0;
  local_68._8_8_ = 0;
  std::__shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->fedCallbacks).
              super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2> *)local_68);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->tags);
  ppVar4 = (fedInfo->timeProps).
           super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar7 = (fedInfo->timeProps).
                super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar4; ppVar7 = ppVar7 + 1) {
    setProperty(this,ppVar7->first,(Time)(ppVar7->second).internalTimeCode);
  }
  ppVar5 = (fedInfo->intProps).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ppVar8 = (fedInfo->intProps).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar5; ppVar8 = ppVar8 + 1) {
    setProperty(this,ppVar8->first,ppVar8->second);
  }
  ppVar6 = (fedInfo->flagProps).
           super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ppVar9 = (fedInfo->flagProps).
                super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
                _M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar6; ppVar9 = ppVar9 + 1) {
    setOptionFlag(this,ppVar9->first,ppVar9->second);
  }
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:231:9)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:231:9)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  std::function<void_(helics::ActionMessage_&&)>::operator=
            ((function<void_(helics::ActionMessage_&&)> *)
             &((this->mLogManager)._M_t.
               super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
               .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->mTransmit,
             (function<void_(helics::ActionMessage_&&)> *)&local_48);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  this->maxLogLevel =
       (((this->mLogManager)._M_t.
         super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>._M_t.
         super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>.
         super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->maxLogLevel).
       super___atomic_base<int>._M_i;
  return;
}

Assistant:

void FederateState::reset(const CoreFederateInfo& fedInfo)
{
    state = FederateStates::CREATED;
    queue.clear();
    delayQueues.clear();
    interfaceInformation.reset();

    timeCoord =
        std::make_unique<TimeCoordinator>([this](const ActionMessage& msg) { routeMessage(msg); });

    only_transmit_on_change = false;
    realtime = false;
    observer = false;
    // reentrant should stay the same
    mSourceOnly = false;
    mCallbackBased = false;
    strict_input_type_checking = false;
    ignore_unit_mismatch = false;
    mSlowResponding = false;
    // allow remote control needs to remain the same

    mLogManager = std::make_unique<LogManager>();
    maxLogLevel = HELICS_LOG_LEVEL_NO_PRINT;
    init_transmitted = false;

    wait_for_current_time = false;
    ignore_time_mismatch_warnings = false;
    mProfilerActive = false;
    mLocalProfileCapture = false;
    errorCode = 0;
    // leave mParent alone
    // CommonCore* mParent{nullptr};  //!< pointer to the higher level;
    errorString.clear();
    rt_lag = timeZero;
    rt_lead = timeZero;
    grantTimeOutPeriod = timeZero;
    realTimeTimerIndex = -1;
    grantTimeoutTimeIndex = -1;
    initRequested = false;
    requestingMode = false;
    initIterating = false;

    iterating = false;
    timeGranted_mode = false;
    terminate_on_error = false;
    lastIterationRequest = IterationRequest::NO_ITERATIONS;
    timeMethod = TimeSynchronizationMethod::DISTRIBUTED;
    mGrantCount = 0;
    commandQueue.clear();
    interfaceFlags = 0;

    events.clear();
    eventMessages.clear();
    delayedFederates.clear();
    time_granted = startupTime;
    allowed_send_time = startupTime;

    queryCallbacks.clear();
    fedCallbacks = nullptr;
    tags.clear();
    // now update with the new properties
    for (const auto& prop : fedInfo.timeProps) {
        setProperty(prop.first, prop.second);
    }
    for (const auto& prop : fedInfo.intProps) {
        setProperty(prop.first, prop.second);
    }
    for (const auto& prop : fedInfo.flagProps) {
        setOptionFlag(prop.first, prop.second);
    }
    mLogManager->setTransmitCallback(
        [this](ActionMessage&& message) { mParent->addActionMessage(std::move(message)); });
    maxLogLevel = mLogManager->getMaxLevel();
}